

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int yy_lac(yy_state_t *yyesa,yy_state_t **yyes,long *yyes_capacity,yy_state_t *yyssp,
          yysymbol_kind_t yytoken)

{
  long lVar1;
  short *psVar2;
  yy_state_t *__dest;
  short *psVar3;
  yy_state_t yVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  yy_state_t *pyVar8;
  long lVar9;
  
  if (yytoken == YYSYMBOL_YYUNDEF) {
    return 1;
  }
  yVar4 = *yyssp;
  pyVar8 = yyssp;
  do {
    if (((yypact[yVar4] == -0x1d8) || (uVar5 = yypact[yVar4] + yytoken, 0xa2c < uVar5)) ||
       (yycheck[uVar5] != yytoken)) {
      lVar1 = (long)yydefact[yVar4];
      if (lVar1 == 0) {
        return 1;
      }
    }
    else {
      if (0 < (long)yytable[uVar5]) {
        return 0;
      }
      lVar1 = -(long)yytable[uVar5];
    }
    lVar6 = (long)""[lVar1];
    psVar3 = yyssp;
    if (yyssp == pyVar8) {
LAB_001093af:
      if (lVar6 != 0) {
        psVar3 = pyVar8 + -lVar6;
        pyVar8 = psVar3;
      }
    }
    else {
      uVar7 = (long)yyssp - (long)*yyes >> 1;
      if ((long)uVar7 < lVar6) {
        lVar6 = lVar6 + ~uVar7;
        psVar3 = pyVar8;
        goto LAB_001093af;
      }
      psVar3 = yyssp + -lVar6;
    }
    uVar5 = (int)yyr1[(long)yyr1[lVar1] + 0x13d] + (int)*psVar3;
    if ((uVar5 < 0xa2d) && (yycheck[uVar5] == *psVar3)) {
      psVar2 = yytable + uVar5;
    }
    else {
      psVar2 = yydefgoto + (long)yyr1[lVar1] + -0xd3;
    }
    yVar4 = *psVar2;
    yyssp = *yyes;
    if (psVar3 != pyVar8) {
      lVar6 = (long)psVar3 - (long)yyssp >> 1;
      lVar1 = lVar6 + 1;
      if (*yyes_capacity <= lVar1) {
        if (0x270e < lVar6) {
          return -2;
        }
        lVar9 = lVar1 * 2 + 2;
        if (9999 < lVar9) {
          lVar9 = 10000;
        }
        __dest = (yy_state_t *)malloc(lVar9 * 2);
        if (__dest == (yy_state_t *)0x0) {
          return -2;
        }
        memcpy(__dest,yyssp,lVar1 * 2);
        if (yyssp != yyesa) {
          free(yyssp);
        }
        psVar3 = __dest + lVar6;
        *yyes = __dest;
        *yyes_capacity = lVar9;
      }
      yyssp = psVar3 + 1;
    }
    *yyssp = yVar4;
  } while( true );
}

Assistant:

static int
yy_lac (yy_state_t *yyesa, yy_state_t **yyes,
        YYPTRDIFF_T *yyes_capacity, yy_state_t *yyssp, yysymbol_kind_t yytoken)
{
  yy_state_t *yyes_prev = yyssp;
  yy_state_t *yyesp = yyes_prev;
  /* Reduce until we encounter a shift and thereby accept the token.  */
  YYDPRINTF ((stderr, "LAC: checking lookahead %s:", yysymbol_name (yytoken)));
  if (yytoken == YYSYMBOL_YYUNDEF)
    {
      YYDPRINTF ((stderr, " Always Err\n"));
      return 1;
    }
  while (1)
    {
      int yyrule = yypact[+*yyesp];
      if (yypact_value_is_default (yyrule)
          || (yyrule += yytoken) < 0 || YYLAST < yyrule
          || yycheck[yyrule] != yytoken)
        {
          /* Use the default action.  */
          yyrule = yydefact[+*yyesp];
          if (yyrule == 0)
            {
              YYDPRINTF ((stderr, " Err\n"));
              return 1;
            }
        }
      else
        {
          /* Use the action from yytable.  */
          yyrule = yytable[yyrule];
          if (yytable_value_is_error (yyrule))
            {
              YYDPRINTF ((stderr, " Err\n"));
              return 1;
            }
          if (0 < yyrule)
            {
              YYDPRINTF ((stderr, " S%d\n", yyrule));
              return 0;
            }
          yyrule = -yyrule;
        }
      /* By now we know we have to simulate a reduce.  */
      YYDPRINTF ((stderr, " R%d", yyrule - 1));
      {
        /* Pop the corresponding number of values from the stack.  */
        YYPTRDIFF_T yylen = yyr2[yyrule];
        /* First pop from the LAC stack as many tokens as possible.  */
        if (yyesp != yyes_prev)
          {
            YYPTRDIFF_T yysize = yyesp - *yyes + 1;
            if (yylen < yysize)
              {
                yyesp -= yylen;
                yylen = 0;
              }
            else
              {
                yyesp = yyes_prev;
                yylen -= yysize;
              }
          }
        /* Only afterwards look at the main stack.  */
        if (yylen)
          yyesp = yyes_prev -= yylen;
      }
      /* Push the resulting state of the reduction.  */
      {
        yy_state_fast_t yystate;
        {
          const int yylhs = yyr1[yyrule] - YYNTOKENS;
          const int yyi = yypgoto[yylhs] + *yyesp;
          yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyesp
                     ? yytable[yyi]
                     : yydefgoto[yylhs]);
        }
        if (yyesp == yyes_prev)
          {
            yyesp = *yyes;
            YY_IGNORE_USELESS_CAST_BEGIN
            *yyesp = YY_CAST (yy_state_t, yystate);
            YY_IGNORE_USELESS_CAST_END
          }
        else
          {
            if (yy_lac_stack_realloc (yyes_capacity, 1,
#if YYDEBUG
                                      " (", ")",
#endif
                                      yyes, yyesa, &yyesp, yyes_prev))
              {
                YYDPRINTF ((stderr, "\n"));
                return YYENOMEM;
              }
            YY_IGNORE_USELESS_CAST_BEGIN
            *++yyesp = YY_CAST (yy_state_t, yystate);
            YY_IGNORE_USELESS_CAST_END
          }
        YYDPRINTF ((stderr, " G%d", yystate));
      }
    }
}

/* Context of a parse error.  */
typedef struct
{
  yy_state_t *yyssp;
  yy_state_t *yyesa;
  yy_state_t **yyes;
  YYPTRDIFF_T *yyes_capacity;
  yysymbol_kind_t yytoken;
} yypcontext_t;

/* Put in YYARG at most YYARGN of the expected tokens given the
   current YYCTX, and return the number of tokens stored in YYARG.  If
   YYARG is null, return the number of expected tokens (guaranteed to
   be less than YYNTOKENS).  Return YYENOMEM on memory exhaustion.
   Return 0 if there are more than YYARGN expected tokens, yet fill
   YYARG up to YYARGN. */
static int
yypcontext_expected_tokens (const yypcontext_t *yyctx,
                            yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;

  int yyx;
  for (yyx = 0; yyx < YYNTOKENS; ++yyx)
    {
      yysymbol_kind_t yysym = YY_CAST (yysymbol_kind_t, yyx);
      if (yysym != YYSYMBOL_YYerror && yysym != YYSYMBOL_YYUNDEF)
        switch (yy_lac (yyctx->yyesa, yyctx->yyes, yyctx->yyes_capacity, yyctx->yyssp, yysym))
          {
          case YYENOMEM:
            return YYENOMEM;
          case 1:
            continue;
          default:
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = yysym;
          }
    }
  if (yyarg && yycount == 0 && 0 < yyargn)
    yyarg[0] = YYSYMBOL_YYEMPTY;
  return yycount;
}




#ifndef yystrlen
# if defined __GLIBC__ && defined _STRING_H
#  define yystrlen(S) (YY_CAST (YYPTRDIFF_T, strlen (S)))
# else
/* Return the length of YYSTR.  */
static YYPTRDIFF_T
yystrlen (const char *yystr)
{
  YYPTRDIFF_T yylen;
  for (yylen = 0; yystr[yylen]; yylen++)
    continue;
  return yylen;
}
# endif
#endif

#ifndef yystpcpy
# if defined __GLIBC__ && defined _STRING_H && defined _GNU_SOURCE
#  define yystpcpy stpcpy
# else
/* Copy YYSRC to YYDEST, returning the address of the terminating '\0' in
   YYDEST.  */
static char *
yystpcpy (char *yydest, const char *yysrc)
{
  char *yyd = yydest;
  const char *yys = yysrc;

  while ((*yyd++ = *yys++) != '\0')
    continue;

  return yyd - 1;
}
# endif
#endif



static int
yy_syntax_error_arguments (const yypcontext_t *yyctx,
                           yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;
  /* There are many possibilities here to consider:
     - If this state is a consistent state with a default action, then
       the only way this function was invoked is if the default action
       is an error action.  In that case, don't check for expected
       tokens because there are none.
     - The only way there can be no lookahead present (in yychar) is if
       this state is a consistent state with a default action.  Thus,
       detecting the absence of a lookahead is sufficient to determine
       that there is no unexpected or expected token to report.  In that
       case, just report a simple "syntax error".
     - Don't assume there isn't a lookahead just because this state is a
       consistent state with a default action.  There might have been a
       previous inconsistent state, consistent state with a non-default
       action, or user semantic action that manipulated yychar.
       In the first two cases, it might appear that the current syntax
       error should have been detected in the previous state when yy_lac
       was invoked.  However, at that time, there might have been a
       different syntax error that discarded a different initial context
       during error recovery, leaving behind the current lookahead.
  */
  if (yyctx->yytoken != YYSYMBOL_YYEMPTY)
    {
      int yyn;
      YYDPRINTF ((stderr, "Constructing syntax error message\n"));
      if (yyarg)
        yyarg[yycount] = yyctx->yytoken;
      ++yycount;
      yyn = yypcontext_expected_tokens (yyctx,
                                        yyarg ? yyarg + 1 : yyarg, yyargn - 1);
      if (yyn == YYENOMEM)
        return YYENOMEM;
      else if (yyn == 0)
        YYDPRINTF ((stderr, "No expected tokens.\n"));
      else
        yycount += yyn;
    }
  return yycount;
}

/* Copy into *YYMSG, which is of size *YYMSG_ALLOC, an error message
   about the unexpected token YYTOKEN for the state stack whose top is
   YYSSP.  In order to see if a particular token T is a
   valid looakhead, invoke yy_lac (YYESA, YYES, YYES_CAPACITY, YYSSP, T).

   Return 0 if *YYMSG was successfully written.  Return -1 if *YYMSG is
   not large enough to hold the message.  In that case, also set
   *YYMSG_ALLOC to the required number of bytes.  Return YYENOMEM if the
   required number of bytes is too large to store or if
   yy_lac returned YYENOMEM.  */
static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yystrlen (yysymbol_name (yyarg[yyi]));
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp = yystpcpy (yyp, yysymbol_name (yyarg[yyi++]));
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}


/*-----------------------------------------------.
| Release the memory associated to this symbol.  |
`-----------------------------------------------*/

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep)
{
  YY_USE (yyvaluep);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}


/* Lookahead token kind.  */
int yychar;

/* The semantic value of the lookahead symbol.  */
YYSTYPE yylval;
/* Number of syntax errors so far.  */
int yynerrs;




/*----------.
| yyparse.  |
`----------*/

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    yy_state_t yyesa[20];
    yy_state_t *yyes = yyesa;
    YYPTRDIFF_T yyes_capacity = 20 < YYMAXDEPTH ? 20 : YYMAXDEPTH;

  /* Whether LAC context is established.  A Boolean.  */
  int yy_lac_established = 0;
  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= T_EOF)
    {
      yychar = T_EOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    {
      YY_LAC_ESTABLISH;
      goto yydefault;
    }
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      YY_LAC_ESTABLISH;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  YY_LAC_DISCARD ("shift");
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  {
    int yychar_backup = yychar;
    switch (yyn)
      {
  case 8: /* opt_diff_mark: "+"  */
#line 730 "asm/parser.y"
                           {
			error("syntax error, unexpected + at the beginning of the line (is it a leftover diff mark?)\n");
		}
#line 3429 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 9: /* opt_diff_mark: "-"  */
#line 733 "asm/parser.y"
                           {
			error("syntax error, unexpected - at the beginning of the line (is it a leftover diff mark?)\n");
		}
#line 3437 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 12: /* $@1: %empty  */
#line 741 "asm/parser.y"
                        {
			lexer_SetMode(LEXER_NORMAL);
			lexer_ToggleStringExpansion(true);
		}
#line 3446 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 13: /* line: error $@1 endofline  */
#line 744 "asm/parser.y"
                            {
			fstk_StopRept();
			yyerrok;
		}
#line 3455 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 14: /* $@2: %empty  */
#line 749 "asm/parser.y"
                                {
			lexer_SetMode(LEXER_NORMAL);
			lexer_ToggleStringExpansion(true);
		}
#line 3464 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 15: /* line: "label" error $@2 endofline  */
#line 752 "asm/parser.y"
                            {
			struct Symbol *macro = sym_FindExactSymbol((yyvsp[-3].symName));

			if (macro && macro->type == SYM_MACRO)
				fprintf(stderr,
					"    To invoke `%s` as a macro it must be indented\n", (yyvsp[-3].symName));
			fstk_StopRept();
			yyerrok;
		}
#line 3478 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 24: /* if: "IF" const "newline"  */
#line 778 "asm/parser.y"
                                           {
			lexer_IncIFDepth();

			if ((yyvsp[-1].constValue))
				lexer_RunIFBlock();
			else
				lexer_SetMode(LEXER_SKIP_TO_ELIF);
		}
#line 3491 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 25: /* elif: "ELIF" const "newline"  */
#line 788 "asm/parser.y"
                                             {
			if (lexer_GetIFDepth() == 0)
				fatalerror("Found ELIF outside an IF construct\n");

			if (lexer_RanIFBlock()) {
				if (lexer_ReachedELSEBlock())
					fatalerror("Found ELIF after an ELSE block\n");

				lexer_SetMode(LEXER_SKIP_TO_ENDC);
			} else if ((yyvsp[-1].constValue)) {
				lexer_RunIFBlock();
			} else {
				lexer_SetMode(LEXER_SKIP_TO_ELIF);
			}
		}
#line 3511 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 26: /* else: "ELSE" "newline"  */
#line 805 "asm/parser.y"
                                       {
			if (lexer_GetIFDepth() == 0)
				fatalerror("Found ELSE outside an IF construct\n");

			if (lexer_RanIFBlock()) {
				if (lexer_ReachedELSEBlock())
					fatalerror("Found ELSE after an ELSE block\n");

				lexer_SetMode(LEXER_SKIP_TO_ENDC);
			} else {
				lexer_RunIFBlock();
				lexer_ReachELSEBlock();
			}
		}
#line 3530 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 32: /* endc: "ENDC"  */
#line 828 "asm/parser.y"
                             {
			lexer_DecIFDepth();
		}
#line 3538 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 33: /* $@3: %empty  */
#line 833 "asm/parser.y"
                           {
			lexer_ToggleStringExpansion(false);
		}
#line 3546 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 34: /* def_id: "DEF" $@3 "identifier"  */
#line 835 "asm/parser.y"
                       {
			lexer_ToggleStringExpansion(true);
			strcpy((yyval.symName), (yyvsp[0].symName));
		}
#line 3555 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 35: /* $@4: %empty  */
#line 841 "asm/parser.y"
                              {
			lexer_ToggleStringExpansion(false);
		}
#line 3563 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 36: /* redef_id: "REDEF" $@4 "identifier"  */
#line 843 "asm/parser.y"
                       {
			lexer_ToggleStringExpansion(true);
			strcpy((yyval.symName), (yyvsp[0].symName));
		}
#line 3572 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 43: /* label: ":"  */
#line 855 "asm/parser.y"
                          {
			sym_AddAnonLabel();
		}
#line 3580 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 44: /* label: "local identifier"  */
#line 858 "asm/parser.y"
                             {
			sym_AddLocalLabel((yyvsp[0].symName));
		}
#line 3588 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 45: /* label: "local identifier" ":"  */
#line 861 "asm/parser.y"
                                     {
			sym_AddLocalLabel((yyvsp[-1].symName));
		}
#line 3596 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 46: /* label: "label" ":"  */
#line 864 "asm/parser.y"
                                  {
			sym_AddLabel((yyvsp[-1].symName));
		}
#line 3604 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 47: /* label: "local identifier" "::"  */
#line 867 "asm/parser.y"
                                            {
			sym_AddLocalLabel((yyvsp[-1].symName));
			sym_Export((yyvsp[-1].symName));
		}
#line 3613 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 48: /* label: "label" "::"  */
#line 871 "asm/parser.y"
                                         {
			sym_AddLabel((yyvsp[-1].symName));
			sym_Export((yyvsp[-1].symName));
		}
#line 3622 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 49: /* $@5: %empty  */
#line 877 "asm/parser.y"
                       {
			// Parsing 'macroargs' will restore the lexer's normal mode
			lexer_SetMode(LEXER_RAW);
		}
#line 3631 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 50: /* macro: "identifier" $@5 macroargs  */
#line 880 "asm/parser.y"
                            {
			fstk_RunMacro((yyvsp[-2].symName), (yyvsp[0].macroArg));
		}
#line 3639 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 51: /* macroargs: %empty  */
#line 885 "asm/parser.y"
                         {
			(yyval.macroArg) = macro_NewArgs();
		}
#line 3647 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 52: /* macroargs: macroargs "string"  */
#line 888 "asm/parser.y"
                                     {
			macro_AppendArg(&((yyval.macroArg)), strdup((yyvsp[0].string)));
		}
#line 3655 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 102: /* compoundeq: "+="  */
#line 948 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_ADD; }
#line 3661 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 103: /* compoundeq: "-="  */
#line 949 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_SUB; }
#line 3667 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 104: /* compoundeq: "*="  */
#line 950 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_MUL; }
#line 3673 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 105: /* compoundeq: "/="  */
#line 951 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_DIV; }
#line 3679 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 106: /* compoundeq: "%="  */
#line 952 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_MOD; }
#line 3685 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 107: /* compoundeq: "^="  */
#line 953 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_XOR; }
#line 3691 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 108: /* compoundeq: "|="  */
#line 954 "asm/parser.y"
                             { (yyval.compoundEqual) = RPN_OR; }
#line 3697 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 109: /* compoundeq: "&="  */
#line 955 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_AND; }
#line 3703 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 110: /* compoundeq: "<<="  */
#line 956 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_SHL; }
#line 3709 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 111: /* compoundeq: ">>="  */
#line 957 "asm/parser.y"
                              { (yyval.compoundEqual) = RPN_SHR; }
#line 3715 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 112: /* equ: "label" "EQU" const  */
#line 960 "asm/parser.y"
                                          {
			warning(WARNING_OBSOLETE, "`%s EQU` is deprecated; use `DEF %s EQU`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddEqu((yyvsp[-2].symName), (yyvsp[0].constValue));
		}
#line 3724 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 113: /* assignment: "label" "=" const  */
#line 966 "asm/parser.y"
                                            {
			warning(WARNING_OBSOLETE, "`%s =` is deprecated; use `DEF %s =`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddVar((yyvsp[-2].symName), (yyvsp[0].constValue));
		}
#line 3733 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 114: /* assignment: "label" compoundeq const  */
#line 970 "asm/parser.y"
                                           {
			const char *compoundEqOperator = NULL;
			switch ((yyvsp[-1].compoundEqual)) {
				case RPN_ADD: compoundEqOperator = "+="; break;
				case RPN_SUB: compoundEqOperator = "-="; break;
				case RPN_MUL: compoundEqOperator = "*="; break;
				case RPN_DIV: compoundEqOperator = "/="; break;
				case RPN_MOD: compoundEqOperator = "%="; break;
				case RPN_XOR: compoundEqOperator = "^="; break;
				case RPN_OR:  compoundEqOperator = "|="; break;
				case RPN_AND: compoundEqOperator = "&="; break;
				case RPN_SHL: compoundEqOperator = "<<="; break;
				case RPN_SHR: compoundEqOperator = ">>="; break;
				default: break;
			}

			warning(WARNING_OBSOLETE, "`%s %s` is deprecated; use `DEF %s %s`\n",
				(yyvsp[-2].symName), compoundEqOperator, (yyvsp[-2].symName), compoundEqOperator);
			compoundAssignment((yyvsp[-2].symName), (yyvsp[-1].compoundEqual), (yyvsp[0].constValue));
		}
#line 3758 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 115: /* equs: "label" "EQUS" string  */
#line 992 "asm/parser.y"
                                            {
			warning(WARNING_OBSOLETE, "`%s EQUS` is deprecated; use `DEF %s EQUS`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddString((yyvsp[-2].symName), (yyvsp[0].string));
		}
#line 3767 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 116: /* rb: "label" "RB" rs_uconst  */
#line 998 "asm/parser.y"
                                             {
			warning(WARNING_OBSOLETE, "`%s RB` is deprecated; use `DEF %s RB`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + (yyvsp[0].constValue));
		}
#line 3777 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 117: /* rw: "label" "RW" rs_uconst  */
#line 1005 "asm/parser.y"
                                             {
			warning(WARNING_OBSOLETE, "`%s RW` is deprecated; use `DEF %s RW`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + 2 * (yyvsp[0].constValue));
		}
#line 3787 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 118: /* rl: "label" "rl" rs_uconst  */
#line 1012 "asm/parser.y"
                                             {
			warning(WARNING_OBSOLETE, "`%s RL` is deprecated; use `DEF %s RL`\n", (yyvsp[-2].symName), (yyvsp[-2].symName));
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + 4 * (yyvsp[0].constValue));
		}
#line 3797 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 119: /* align: "ALIGN" uconst  */
#line 1019 "asm/parser.y"
                                    {
			if ((yyvsp[0].constValue) > 16)
				error("Alignment must be between 0 and 16, not %u\n", (yyvsp[0].constValue));
			else
				sect_AlignPC((yyvsp[0].constValue), 0);
		}
#line 3808 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 120: /* align: "ALIGN" uconst "," uconst  */
#line 1025 "asm/parser.y"
                                                   {
			if ((yyvsp[-2].constValue) > 16)
				error("Alignment must be between 0 and 16, not %u\n", (yyvsp[-2].constValue));
			else if ((yyvsp[0].constValue) >= 1 << (yyvsp[-2].constValue))
				error("Offset must be between 0 and %u, not %u\n",
					(1 << (yyvsp[-2].constValue)) - 1, (yyvsp[0].constValue));
			else
				sect_AlignPC((yyvsp[-2].constValue), (yyvsp[0].constValue));
		}
#line 3822 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 121: /* $@6: %empty  */
#line 1036 "asm/parser.y"
                            {
			// Parsing 'opt_list' will restore the lexer's normal mode
			lexer_SetMode(LEXER_RAW);
		}
#line 3831 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 125: /* opt_list_entry: "string"  */
#line 1046 "asm/parser.y"
                           { opt_Parse((yyvsp[0].string)); }
#line 3837 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 126: /* popo: "POPO"  */
#line 1049 "asm/parser.y"
                             { opt_Pop(); }
#line 3843 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 127: /* pusho: "PUSHO"  */
#line 1052 "asm/parser.y"
                              { opt_Push(); }
#line 3849 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 128: /* pops: "POPS"  */
#line 1055 "asm/parser.y"
                             { sect_PopSection(); }
#line 3855 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 129: /* pushs: "PUSHS"  */
#line 1058 "asm/parser.y"
                              { sect_PushSection(); }
#line 3861 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 130: /* endsection: "ENDSECTION"  */
#line 1061 "asm/parser.y"
                                   { sect_EndSection(); }
#line 3867 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 131: /* fail: "FAIL" string  */
#line 1064 "asm/parser.y"
                                    { fatalerror("%s\n", (yyvsp[0].string)); }
#line 3873 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 132: /* warn: "WARN" string  */
#line 1067 "asm/parser.y"
                                    { warning(WARNING_USER, "%s\n", (yyvsp[0].string)); }
#line 3879 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 133: /* assert_type: %empty  */
#line 1070 "asm/parser.y"
                         { (yyval.assertType) = ASSERT_ERROR; }
#line 3885 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 134: /* assert_type: "WARN" ","  */
#line 1071 "asm/parser.y"
                                     { (yyval.assertType) = ASSERT_WARN; }
#line 3891 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 135: /* assert_type: "FAIL" ","  */
#line 1072 "asm/parser.y"
                                     { (yyval.assertType) = ASSERT_ERROR; }
#line 3897 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 136: /* assert_type: "FATAL" ","  */
#line 1073 "asm/parser.y"
                                      { (yyval.assertType) = ASSERT_FATAL; }
#line 3903 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 137: /* assert: "ASSERT" assert_type relocexpr  */
#line 1076 "asm/parser.y"
                                                     {
			if (!rpn_isKnown(&(yyvsp[0].expr))) {
				if (!out_CreateAssert((yyvsp[-1].assertType), &(yyvsp[0].expr), "",
						      sect_GetOutputOffset()))
					error("Assertion creation failed: %s\n",
						strerror(errno));
			} else if ((yyvsp[0].expr).val == 0) {
				failAssert((yyvsp[-1].assertType));
			}
			rpn_Free(&(yyvsp[0].expr));
		}
#line 3919 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 138: /* assert: "ASSERT" assert_type relocexpr "," string  */
#line 1087 "asm/parser.y"
                                                                    {
			if (!rpn_isKnown(&(yyvsp[-2].expr))) {
				if (!out_CreateAssert((yyvsp[-3].assertType), &(yyvsp[-2].expr), (yyvsp[0].string),
						      sect_GetOutputOffset()))
					error("Assertion creation failed: %s\n",
						strerror(errno));
			} else if ((yyvsp[-2].expr).val == 0) {
				failAssertMsg((yyvsp[-3].assertType), (yyvsp[0].string));
			}
			rpn_Free(&(yyvsp[-2].expr));
		}
#line 3935 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 139: /* assert: "STATIC_ASSERT" assert_type const  */
#line 1098 "asm/parser.y"
                                                        {
			if ((yyvsp[0].constValue) == 0)
				failAssert((yyvsp[-1].assertType));
		}
#line 3944 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 140: /* assert: "STATIC_ASSERT" assert_type const "," string  */
#line 1102 "asm/parser.y"
                                                                       {
			if ((yyvsp[-2].constValue) == 0)
				failAssertMsg((yyvsp[-3].assertType), (yyvsp[0].string));
		}
#line 3953 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 141: /* shift: "SHIFT"  */
#line 1108 "asm/parser.y"
                              { macro_ShiftCurrentArgs(1); }
#line 3959 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 142: /* shift: "SHIFT" const  */
#line 1109 "asm/parser.y"
                                    { macro_ShiftCurrentArgs((yyvsp[0].constValue)); }
#line 3965 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 143: /* load: "LOAD" sectmod string "," sectiontype sectorg sectattrs  */
#line 1112 "asm/parser.y"
                                                                                  {
			sect_SetLoadSection((yyvsp[-4].string), (enum SectionType)(yyvsp[-2].constValue), (yyvsp[-1].constValue), &(yyvsp[0].sectSpec), (yyvsp[-5].sectMod));
		}
#line 3973 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 144: /* load: "ENDL"  */
#line 1115 "asm/parser.y"
                             { sect_EndLoadSection(); }
#line 3979 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 145: /* @7: %empty  */
#line 1118 "asm/parser.y"
                                              {
			(yyval.captureTerminated) = lexer_CaptureRept(&captureBody);
		}
#line 3987 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 146: /* rept: "REPT" uconst "newline" @7 endofline  */
#line 1120 "asm/parser.y"
                            {
			if ((yyvsp[-1].captureTerminated))
				fstk_RunRept((yyvsp[-3].constValue), captureBody.lineNo, captureBody.body,
					     captureBody.size);
		}
#line 3997 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 147: /* $@8: %empty  */
#line 1127 "asm/parser.y"
                            {
			lexer_ToggleStringExpansion(false);
		}
#line 4005 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 148: /* $@9: %empty  */
#line 1129 "asm/parser.y"
                       {
			lexer_ToggleStringExpansion(true);
		}
#line 4013 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 149: /* @10: %empty  */
#line 1131 "asm/parser.y"
                                             {
			(yyval.captureTerminated) = lexer_CaptureRept(&captureBody);
		}
#line 4021 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 150: /* for: "FOR" $@8 "identifier" $@9 "," for_args "newline" @10 endofline  */
#line 1133 "asm/parser.y"
                            {
			if ((yyvsp[-1].captureTerminated))
				fstk_RunFor((yyvsp[-6].symName), (yyvsp[-3].forArgs).start, (yyvsp[-3].forArgs).stop, (yyvsp[-3].forArgs).step, captureBody.lineNo,
					    captureBody.body, captureBody.size);
		}
#line 4031 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 151: /* for_args: const  */
#line 1139 "asm/parser.y"
                        {
			(yyval.forArgs).start = 0;
			(yyval.forArgs).stop = (yyvsp[0].constValue);
			(yyval.forArgs).step = 1;
		}
#line 4041 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 152: /* for_args: const "," const  */
#line 1144 "asm/parser.y"
                                      {
			(yyval.forArgs).start = (yyvsp[-2].constValue);
			(yyval.forArgs).stop = (yyvsp[0].constValue);
			(yyval.forArgs).step = 1;
		}
#line 4051 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 153: /* for_args: const "," const "," const  */
#line 1149 "asm/parser.y"
                                                    {
			(yyval.forArgs).start = (yyvsp[-4].constValue);
			(yyval.forArgs).stop = (yyvsp[-2].constValue);
			(yyval.forArgs).step = (yyvsp[0].constValue);
		}
#line 4061 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 154: /* break: label "BREAK" endofline  */
#line 1156 "asm/parser.y"
                                              {
			if (fstk_Break())
				lexer_SetMode(LEXER_SKIP_TO_ENDR);
		}
#line 4070 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 155: /* $@11: %empty  */
#line 1162 "asm/parser.y"
                              {
			lexer_ToggleStringExpansion(false);
		}
#line 4078 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 156: /* $@12: %empty  */
#line 1164 "asm/parser.y"
                       {
			lexer_ToggleStringExpansion(true);
		}
#line 4086 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 157: /* @13: %empty  */
#line 1166 "asm/parser.y"
                            {
			(yyval.captureTerminated) = lexer_CaptureMacroBody(&captureBody);
		}
#line 4094 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 158: /* macrodef: "MACRO" $@11 "identifier" $@12 "newline" @13 endofline  */
#line 1168 "asm/parser.y"
                            {
			if ((yyvsp[-1].captureTerminated))
				sym_AddMacro((yyvsp[-4].symName), captureBody.lineNo, captureBody.body,
					     captureBody.size);
		}
#line 4104 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 159: /* rsset: "RSSET" uconst  */
#line 1175 "asm/parser.y"
                                     { sym_AddVar("_RS", (yyvsp[0].constValue)); }
#line 4110 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 160: /* rsreset: "RSRESET"  */
#line 1178 "asm/parser.y"
                                { sym_AddVar("_RS", 0); }
#line 4116 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 161: /* rs_uconst: %empty  */
#line 1181 "asm/parser.y"
                         { (yyval.constValue) = 1; }
#line 4122 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 163: /* union: "UNION"  */
#line 1185 "asm/parser.y"
                              { sect_StartUnion(); }
#line 4128 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 164: /* nextu: "NEXTU"  */
#line 1188 "asm/parser.y"
                              { sect_NextUnionMember(); }
#line 4134 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 165: /* endu: "ENDU"  */
#line 1191 "asm/parser.y"
                             { sect_EndUnion(); }
#line 4140 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 166: /* ds: "DS" uconst  */
#line 1194 "asm/parser.y"
                                  { sect_Skip((yyvsp[0].constValue), true); }
#line 4146 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 167: /* ds: "DS" uconst "," ds_args trailing_comma  */
#line 1195 "asm/parser.y"
                                                                 {
			sect_RelBytes((yyvsp[-3].constValue), (yyvsp[-1].dsArgs).args, (yyvsp[-1].dsArgs).nbArgs);
			freeDsArgList(&(yyvsp[-1].dsArgs));
		}
#line 4155 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 168: /* ds: "DS" ds_align trailing_comma  */
#line 1199 "asm/parser.y"
                                                   {
			uint32_t n = sect_GetAlignBytes((yyvsp[-1].dsAlign).alignment, (yyvsp[-1].dsAlign).alignOfs);

			sect_Skip(n, true);
			sect_AlignPC((yyvsp[-1].dsAlign).alignment, (yyvsp[-1].dsAlign).alignOfs);
		}
#line 4166 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 169: /* ds: "DS" ds_align "," ds_args trailing_comma  */
#line 1205 "asm/parser.y"
                                                                   {
			uint32_t n = sect_GetAlignBytes((yyvsp[-3].dsAlign).alignment, (yyvsp[-3].dsAlign).alignOfs);

			sect_RelBytes(n, (yyvsp[-1].dsArgs).args, (yyvsp[-1].dsArgs).nbArgs);
			sect_AlignPC((yyvsp[-3].dsAlign).alignment, (yyvsp[-3].dsAlign).alignOfs);
			freeDsArgList(&(yyvsp[-1].dsArgs));
		}
#line 4178 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 170: /* ds_align: "ALIGN" "[" uconst "]"  */
#line 1214 "asm/parser.y"
                                                      {
			if ((yyvsp[-1].constValue) > 16) {
				error("Alignment must be between 0 and 16, not %u\n", (yyvsp[-1].constValue));
			} else {
				(yyval.dsAlign).alignment = (yyvsp[-1].constValue);
				(yyval.dsAlign).alignOfs = 0;
			}
		}
#line 4191 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 171: /* ds_align: "ALIGN" "[" uconst "," uconst "]"  */
#line 1222 "asm/parser.y"
                                                                     {
			if ((yyvsp[-3].constValue) > 16) {
				error("Alignment must be between 0 and 16, not %u\n", (yyvsp[-3].constValue));
			} else if ((yyvsp[-1].constValue) >= 1 << (yyvsp[-3].constValue)) {
				error("Offset must be between 0 and %u, not %u\n",
					(1 << (yyvsp[-3].constValue)) - 1, (yyvsp[-1].constValue));
			} else {
				(yyval.dsAlign).alignment = (yyvsp[-3].constValue);
				(yyval.dsAlign).alignOfs = (yyvsp[-1].constValue);
			}
		}
#line 4207 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 172: /* ds_args: reloc_8bit  */
#line 1235 "asm/parser.y"
                             {
			initDsArgList(&(yyval.dsArgs));
			appendDsArgList(&(yyval.dsArgs), &(yyvsp[0].expr));
		}
#line 4216 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 173: /* ds_args: ds_args "," reloc_8bit  */
#line 1239 "asm/parser.y"
                                             {
			appendDsArgList(&(yyvsp[-2].dsArgs), &(yyvsp[0].expr));
			(yyval.dsArgs) = (yyvsp[-2].dsArgs);
		}
#line 4225 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 174: /* db: "DB"  */
#line 1245 "asm/parser.y"
                           { sect_Skip(1, false); }
#line 4231 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 176: /* dw: "DW"  */
#line 1249 "asm/parser.y"
                           { sect_Skip(2, false); }
#line 4237 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 178: /* dl: "DL"  */
#line 1253 "asm/parser.y"
                           { sect_Skip(4, false); }
#line 4243 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 180: /* def_equ: def_id "EQU" const  */
#line 1257 "asm/parser.y"
                                         { sym_AddEqu((yyvsp[-2].symName), (yyvsp[0].constValue)); }
#line 4249 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 181: /* redef_equ: redef_id "EQU" const  */
#line 1260 "asm/parser.y"
                                           { sym_RedefEqu((yyvsp[-2].symName), (yyvsp[0].constValue)); }
#line 4255 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 182: /* def_set: def_id "=" const  */
#line 1263 "asm/parser.y"
                                           { sym_AddVar((yyvsp[-2].symName), (yyvsp[0].constValue)); }
#line 4261 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 183: /* def_set: redef_id "=" const  */
#line 1264 "asm/parser.y"
                                             { sym_AddVar((yyvsp[-2].symName), (yyvsp[0].constValue)); }
#line 4267 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 184: /* def_set: def_id compoundeq const  */
#line 1265 "asm/parser.y"
                                          { compoundAssignment((yyvsp[-2].symName), (yyvsp[-1].compoundEqual), (yyvsp[0].constValue)); }
#line 4273 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 185: /* def_set: redef_id compoundeq const  */
#line 1266 "asm/parser.y"
                                            { compoundAssignment((yyvsp[-2].symName), (yyvsp[-1].compoundEqual), (yyvsp[0].constValue)); }
#line 4279 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 186: /* def_rb: def_id "RB" rs_uconst  */
#line 1269 "asm/parser.y"
                                            {
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + (yyvsp[0].constValue));
		}
#line 4288 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 187: /* def_rw: def_id "RW" rs_uconst  */
#line 1275 "asm/parser.y"
                                            {
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + 2 * (yyvsp[0].constValue));
		}
#line 4297 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 188: /* def_rl: def_id "rl" rs_uconst  */
#line 1281 "asm/parser.y"
                                            {
			sym_AddEqu((yyvsp[-2].symName), sym_GetConstantValue("_RS"));
			sym_AddVar("_RS", sym_GetConstantValue("_RS") + 4 * (yyvsp[0].constValue));
		}
#line 4306 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 189: /* def_equs: def_id "EQUS" string  */
#line 1287 "asm/parser.y"
                                           { sym_AddString((yyvsp[-2].symName), (yyvsp[0].string)); }
#line 4312 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 190: /* redef_equs: redef_id "EQUS" string  */
#line 1290 "asm/parser.y"
                                             { sym_RedefString((yyvsp[-2].symName), (yyvsp[0].string)); }
#line 4318 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 191: /* $@14: %empty  */
#line 1293 "asm/parser.y"
                              {
			lexer_ToggleStringExpansion(false);
		}
#line 4326 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 192: /* purge: "PURGE" $@14 purge_args trailing_comma  */
#line 1295 "asm/parser.y"
                                            {
			for (uint32_t i = 0; i < (yyvsp[-1].purgeArgs).nbArgs; i++)
				sym_Purge((yyvsp[-1].purgeArgs).args[i]);
			freePurgeArgList(&(yyvsp[-1].purgeArgs));
			lexer_ToggleStringExpansion(true);
		}
#line 4337 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 193: /* purge_args: scoped_id  */
#line 1303 "asm/parser.y"
                            {
			initPurgeArgList(&(yyval.purgeArgs));
			appendPurgeArgList(&(yyval.purgeArgs), strdup((yyvsp[0].symName)));
		}
#line 4346 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 194: /* purge_args: purge_args "," scoped_id  */
#line 1307 "asm/parser.y"
                                               {
			appendPurgeArgList(&(yyvsp[-2].purgeArgs), strdup((yyvsp[0].symName)));
			(yyval.purgeArgs) = (yyvsp[-2].purgeArgs);
		}
#line 4355 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 198: /* export_list_entry: scoped_id  */
#line 1320 "asm/parser.y"
                              { sym_Export((yyvsp[0].symName)); }
#line 4361 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 199: /* include: label "INCLUDE" string endofline  */
#line 1323 "asm/parser.y"
                                                       {
			fstk_RunInclude((yyvsp[-1].string));
			if (failedOnMissingInclude)
				YYACCEPT;
		}
#line 4371 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 200: /* incbin: "INCBIN" string  */
#line 1330 "asm/parser.y"
                                      {
			sect_BinaryFile((yyvsp[0].string), 0);
			if (failedOnMissingInclude)
				YYACCEPT;
		}
#line 4381 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 201: /* incbin: "INCBIN" string "," const  */
#line 1335 "asm/parser.y"
                                                    {
			sect_BinaryFile((yyvsp[-2].string), (yyvsp[0].constValue));
			if (failedOnMissingInclude)
				YYACCEPT;
		}
#line 4391 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 202: /* incbin: "INCBIN" string "," const "," const  */
#line 1340 "asm/parser.y"
                                                                  {
			sect_BinaryFileSlice((yyvsp[-4].string), (yyvsp[-2].constValue), (yyvsp[0].constValue));
			if (failedOnMissingInclude)
				YYACCEPT;
		}
#line 4401 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 203: /* charmap: "CHARMAP" string "," const_8bit  */
#line 1347 "asm/parser.y"
                                                          {
			charmap_Add((yyvsp[-2].string), (uint8_t)(yyvsp[0].constValue));
		}
#line 4409 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 204: /* newcharmap: "NEWCHARMAP" "identifier"  */
#line 1352 "asm/parser.y"
                                        { charmap_New((yyvsp[0].symName), NULL); }
#line 4415 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 205: /* newcharmap: "NEWCHARMAP" "identifier" "," "identifier"  */
#line 1353 "asm/parser.y"
                                                     { charmap_New((yyvsp[-2].symName), (yyvsp[0].symName)); }
#line 4421 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 206: /* setcharmap: "SETCHARMAP" "identifier"  */
#line 1356 "asm/parser.y"
                                        { charmap_Set((yyvsp[0].symName)); }
#line 4427 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 207: /* pushc: "PUSHC"  */
#line 1359 "asm/parser.y"
                              { charmap_Push(); }
#line 4433 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 208: /* popc: "POPC"  */
#line 1362 "asm/parser.y"
                             { charmap_Pop(); }
#line 4439 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 210: /* println: "PRINTLN"  */
#line 1368 "asm/parser.y"
                                {
			putchar('\n');
			fflush(stdout);
		}
#line 4448 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 211: /* println: "PRINTLN" print_exprs trailing_comma  */
#line 1372 "asm/parser.y"
                                                           {
			putchar('\n');
			fflush(stdout);
		}
#line 4457 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 214: /* print_expr: const_no_str  */
#line 1382 "asm/parser.y"
                               { printf("$%" PRIX32, (yyvsp[0].constValue)); }
#line 4463 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 215: /* print_expr: string  */
#line 1383 "asm/parser.y"
                         { printf("%s", (yyvsp[0].string)); }
#line 4469 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 216: /* const_3bit: const  */
#line 1386 "asm/parser.y"
                        {
			int32_t value = (yyvsp[0].constValue);

			if ((value < 0) || (value > 7)) {
				error("Immediate value must be 3-bit\n");
				(yyval.constValue) = 0;
			} else {
				(yyval.constValue) = value & 0x7;
			}
		}
#line 4484 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 219: /* constlist_8bit_entry: reloc_8bit_no_str  */
#line 1402 "asm/parser.y"
                                         {
			sect_RelByte(&(yyvsp[0].expr), 0);
		}
#line 4492 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 220: /* constlist_8bit_entry: string  */
#line 1405 "asm/parser.y"
                         {
			uint8_t *output = (uint8_t *)malloc(strlen((yyvsp[0].string))); // Cannot be larger than that
			size_t length = charmap_Convert((yyvsp[0].string), output);

			sect_AbsByteGroup(output, length);
			free(output);
		}
#line 4504 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 223: /* constlist_16bit_entry: reloc_16bit_no_str  */
#line 1418 "asm/parser.y"
                                           {
			sect_RelWord(&(yyvsp[0].expr), 0);
		}
#line 4512 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 224: /* constlist_16bit_entry: string  */
#line 1421 "asm/parser.y"
                         {
			uint8_t *output = (uint8_t *)malloc(strlen((yyvsp[0].string))); // Cannot be larger than that
			size_t length = charmap_Convert((yyvsp[0].string), output);

			sect_AbsWordGroup(output, length);
			free(output);
		}
#line 4524 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 227: /* constlist_32bit_entry: relocexpr_no_str  */
#line 1434 "asm/parser.y"
                                         {
			sect_RelLong(&(yyvsp[0].expr), 0);
		}
#line 4532 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 228: /* constlist_32bit_entry: string  */
#line 1437 "asm/parser.y"
                         {
			// Charmaps cannot increase the length of a string
			uint8_t *output = (uint8_t *)malloc(strlen((yyvsp[0].string)));
			size_t length = charmap_Convert((yyvsp[0].string), output);

			sect_AbsLongGroup(output, length);
			free(output);
		}
#line 4545 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 229: /* reloc_8bit: relocexpr  */
#line 1447 "asm/parser.y"
                            {
			rpn_CheckNBit(&(yyvsp[0].expr), 8);
			(yyval.expr) = (yyvsp[0].expr);
		}
#line 4554 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 230: /* reloc_8bit_no_str: relocexpr_no_str  */
#line 1453 "asm/parser.y"
                                     {
			rpn_CheckNBit(&(yyvsp[0].expr), 8);
			(yyval.expr) = (yyvsp[0].expr);
		}
#line 4563 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 231: /* reloc_8bit_offset: "+" relocexpr  */
#line 1459 "asm/parser.y"
                                       {
			rpn_CheckNBit(&(yyvsp[0].expr), 8);
			(yyval.expr) = (yyvsp[0].expr);
		}
#line 4572 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 232: /* reloc_8bit_offset: "-" relocexpr  */
#line 1463 "asm/parser.y"
                                     {
			rpn_NEG(&(yyval.expr), &(yyvsp[0].expr));
			rpn_CheckNBit(&(yyval.expr), 8);
		}
#line 4581 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 233: /* reloc_16bit: relocexpr  */
#line 1469 "asm/parser.y"
                            {
			rpn_CheckNBit(&(yyvsp[0].expr), 16);
			(yyval.expr) = (yyvsp[0].expr);
		}
#line 4590 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 234: /* reloc_16bit_no_str: relocexpr_no_str  */
#line 1475 "asm/parser.y"
                                      {
			rpn_CheckNBit(&(yyvsp[0].expr), 16);
			(yyval.expr) = (yyvsp[0].expr);
		}
#line 4599 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 236: /* relocexpr: string  */
#line 1483 "asm/parser.y"
                         {
			// Charmaps cannot increase the length of a string
			uint8_t *output = (uint8_t *)malloc(strlen((yyvsp[0].string)));
			uint32_t length = charmap_Convert((yyvsp[0].string), output);
			uint32_t r = str2int2(output, length);

			free(output);
			rpn_Number(&(yyval.expr), r);
		}
#line 4613 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 237: /* relocexpr_no_str: scoped_anon_id  */
#line 1494 "asm/parser.y"
                                  { rpn_Symbol(&(yyval.expr), (yyvsp[0].symName)); }
#line 4619 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 238: /* relocexpr_no_str: "number"  */
#line 1495 "asm/parser.y"
                           { rpn_Number(&(yyval.expr), (yyvsp[0].constValue)); }
#line 4625 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 239: /* relocexpr_no_str: "!" relocexpr  */
#line 1496 "asm/parser.y"
                                                    {
			rpn_LOGNOT(&(yyval.expr), &(yyvsp[0].expr));
		}
#line 4633 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 240: /* relocexpr_no_str: relocexpr "||" relocexpr  */
#line 1499 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGOR, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4641 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 241: /* relocexpr_no_str: relocexpr "&&" relocexpr  */
#line 1502 "asm/parser.y"
                                                    {
			rpn_BinaryOp(RPN_LOGAND, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4649 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 242: /* relocexpr_no_str: relocexpr "==" relocexpr  */
#line 1505 "asm/parser.y"
                                                    {
			rpn_BinaryOp(RPN_LOGEQ, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4657 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 243: /* relocexpr_no_str: relocexpr ">" relocexpr  */
#line 1508 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGGT, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4665 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 244: /* relocexpr_no_str: relocexpr "<" relocexpr  */
#line 1511 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGLT, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4673 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 245: /* relocexpr_no_str: relocexpr ">=" relocexpr  */
#line 1514 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGGE, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4681 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 246: /* relocexpr_no_str: relocexpr "<=" relocexpr  */
#line 1517 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGLE, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4689 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 247: /* relocexpr_no_str: relocexpr "!=" relocexpr  */
#line 1520 "asm/parser.y"
                                                   {
			rpn_BinaryOp(RPN_LOGNE, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4697 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 248: /* relocexpr_no_str: relocexpr "+" relocexpr  */
#line 1523 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_ADD, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4705 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 249: /* relocexpr_no_str: relocexpr "-" relocexpr  */
#line 1526 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_SUB, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4713 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 250: /* relocexpr_no_str: relocexpr "^" relocexpr  */
#line 1529 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_XOR, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4721 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 251: /* relocexpr_no_str: relocexpr "|" relocexpr  */
#line 1532 "asm/parser.y"
                                              {
			rpn_BinaryOp(RPN_OR, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4729 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 252: /* relocexpr_no_str: relocexpr "&" relocexpr  */
#line 1535 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_AND, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4737 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 253: /* relocexpr_no_str: relocexpr "<<" relocexpr  */
#line 1538 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_SHL, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4745 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 254: /* relocexpr_no_str: relocexpr ">>" relocexpr  */
#line 1541 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_SHR, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4753 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 255: /* relocexpr_no_str: relocexpr ">>>" relocexpr  */
#line 1544 "asm/parser.y"
                                                {
			rpn_BinaryOp(RPN_USHR, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4761 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 256: /* relocexpr_no_str: relocexpr "*" relocexpr  */
#line 1547 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_MUL, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4769 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 257: /* relocexpr_no_str: relocexpr "/" relocexpr  */
#line 1550 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_DIV, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4777 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 258: /* relocexpr_no_str: relocexpr "%" relocexpr  */
#line 1553 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_MOD, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4785 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 259: /* relocexpr_no_str: relocexpr "**" relocexpr  */
#line 1556 "asm/parser.y"
                                               {
			rpn_BinaryOp(RPN_EXP, &(yyval.expr), &(yyvsp[-2].expr), &(yyvsp[0].expr));
		}
#line 4793 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 260: /* relocexpr_no_str: "+" relocexpr  */
#line 1559 "asm/parser.y"
                                               { (yyval.expr) = (yyvsp[0].expr); }
#line 4799 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 261: /* relocexpr_no_str: "-" relocexpr  */
#line 1560 "asm/parser.y"
                                               { rpn_NEG(&(yyval.expr), &(yyvsp[0].expr)); }
#line 4805 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 262: /* relocexpr_no_str: "~" relocexpr  */
#line 1561 "asm/parser.y"
                                               { rpn_NOT(&(yyval.expr), &(yyvsp[0].expr)); }
#line 4811 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 263: /* relocexpr_no_str: "HIGH" "(" relocexpr ")"  */
#line 1562 "asm/parser.y"
                                                        { rpn_HIGH(&(yyval.expr), &(yyvsp[-1].expr)); }
#line 4817 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 264: /* relocexpr_no_str: "LOW" "(" relocexpr ")"  */
#line 1563 "asm/parser.y"
                                                       { rpn_LOW(&(yyval.expr), &(yyvsp[-1].expr)); }
#line 4823 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 265: /* relocexpr_no_str: "ISCONST" "(" relocexpr ")"  */
#line 1564 "asm/parser.y"
                                                           { rpn_ISCONST(&(yyval.expr), &(yyvsp[-1].expr)); }
#line 4829 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 266: /* relocexpr_no_str: "BANK" "(" scoped_anon_id ")"  */
#line 1565 "asm/parser.y"
                                                             {
			// '@' is also a T_ID; it is handled here
			rpn_BankSymbol(&(yyval.expr), (yyvsp[-1].symName));
		}
#line 4838 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 267: /* relocexpr_no_str: "BANK" "(" string ")"  */
#line 1569 "asm/parser.y"
                                                     { rpn_BankSection(&(yyval.expr), (yyvsp[-1].string)); }
#line 4844 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 268: /* relocexpr_no_str: "SIZEOF" "(" string ")"  */
#line 1570 "asm/parser.y"
                                                       { rpn_SizeOfSection(&(yyval.expr), (yyvsp[-1].string)); }
#line 4850 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 269: /* relocexpr_no_str: "STARTOF" "(" string ")"  */
#line 1571 "asm/parser.y"
                                                        { rpn_StartOfSection(&(yyval.expr), (yyvsp[-1].string)); }
#line 4856 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 270: /* relocexpr_no_str: "SIZEOF" "(" sectiontype ")"  */
#line 1572 "asm/parser.y"
                                                            {
			rpn_SizeOfSectionType(&(yyval.expr), (enum SectionType)(yyvsp[-1].constValue));
		}
#line 4864 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 271: /* relocexpr_no_str: "STARTOF" "(" sectiontype ")"  */
#line 1575 "asm/parser.y"
                                                             {
			rpn_StartOfSectionType(&(yyval.expr), (enum SectionType)(yyvsp[-1].constValue));
		}
#line 4872 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 272: /* $@15: %empty  */
#line 1578 "asm/parser.y"
                           {
			lexer_ToggleStringExpansion(false);
		}
#line 4880 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 273: /* relocexpr_no_str: "DEF" $@15 "(" scoped_anon_id ")"  */
#line 1580 "asm/parser.y"
                                                   {
			rpn_Number(&(yyval.expr), sym_FindScopedValidSymbol((yyvsp[-1].symName)) != NULL);

			lexer_ToggleStringExpansion(true);
		}
#line 4890 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 274: /* relocexpr_no_str: "ROUND" "(" const opt_q_arg ")"  */
#line 1585 "asm/parser.y"
                                                               {
			rpn_Number(&(yyval.expr), fix_Round((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4898 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 275: /* relocexpr_no_str: "CEIL" "(" const opt_q_arg ")"  */
#line 1588 "asm/parser.y"
                                                              {
			rpn_Number(&(yyval.expr), fix_Ceil((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4906 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 276: /* relocexpr_no_str: "FLOOR" "(" const opt_q_arg ")"  */
#line 1591 "asm/parser.y"
                                                               {
			rpn_Number(&(yyval.expr), fix_Floor((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4914 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 277: /* relocexpr_no_str: "FDIV" "(" const "," const opt_q_arg ")"  */
#line 1594 "asm/parser.y"
                                                                            {
			rpn_Number(&(yyval.expr), fix_Div((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4922 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 278: /* relocexpr_no_str: "FMUL" "(" const "," const opt_q_arg ")"  */
#line 1597 "asm/parser.y"
                                                                            {
			rpn_Number(&(yyval.expr), fix_Mul((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4930 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 279: /* relocexpr_no_str: "FMOD" "(" const "," const opt_q_arg ")"  */
#line 1600 "asm/parser.y"
                                                                            {
			rpn_Number(&(yyval.expr), fix_Mod((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4938 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 280: /* relocexpr_no_str: "POW" "(" const "," const opt_q_arg ")"  */
#line 1603 "asm/parser.y"
                                                                           {
			rpn_Number(&(yyval.expr), fix_Pow((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4946 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 281: /* relocexpr_no_str: "LOG" "(" const "," const opt_q_arg ")"  */
#line 1606 "asm/parser.y"
                                                                           {
			rpn_Number(&(yyval.expr), fix_Log((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4954 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 282: /* relocexpr_no_str: "SIN" "(" const opt_q_arg ")"  */
#line 1609 "asm/parser.y"
                                                             {
			rpn_Number(&(yyval.expr), fix_Sin((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4962 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 283: /* relocexpr_no_str: "COS" "(" const opt_q_arg ")"  */
#line 1612 "asm/parser.y"
                                                             {
			rpn_Number(&(yyval.expr), fix_Cos((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4970 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 284: /* relocexpr_no_str: "TAN" "(" const opt_q_arg ")"  */
#line 1615 "asm/parser.y"
                                                             {
			rpn_Number(&(yyval.expr), fix_Tan((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4978 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 285: /* relocexpr_no_str: "ASIN" "(" const opt_q_arg ")"  */
#line 1618 "asm/parser.y"
                                                              {
			rpn_Number(&(yyval.expr), fix_ASin((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4986 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 286: /* relocexpr_no_str: "ACOS" "(" const opt_q_arg ")"  */
#line 1621 "asm/parser.y"
                                                              {
			rpn_Number(&(yyval.expr), fix_ACos((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 4994 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 287: /* relocexpr_no_str: "ATAN" "(" const opt_q_arg ")"  */
#line 1624 "asm/parser.y"
                                                              {
			rpn_Number(&(yyval.expr), fix_ATan((yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 5002 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 288: /* relocexpr_no_str: "ATAN2" "(" const "," const opt_q_arg ")"  */
#line 1627 "asm/parser.y"
                                                                             {
			rpn_Number(&(yyval.expr), fix_ATan2((yyvsp[-4].constValue), (yyvsp[-2].constValue), (yyvsp[-1].constValue)));
		}
#line 5010 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 289: /* relocexpr_no_str: "STRCMP" "(" string "," string ")"  */
#line 1630 "asm/parser.y"
                                                                      {
			rpn_Number(&(yyval.expr), strcmp((yyvsp[-3].string), (yyvsp[-1].string)));
		}
#line 5018 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 290: /* relocexpr_no_str: "STRIN" "(" string "," string ")"  */
#line 1633 "asm/parser.y"
                                                                     {
			char const *p = strstr((yyvsp[-3].string), (yyvsp[-1].string));

			rpn_Number(&(yyval.expr), p ? p - (yyvsp[-3].string) + 1 : 0);
		}
#line 5028 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 291: /* relocexpr_no_str: "STRRIN" "(" string "," string ")"  */
#line 1638 "asm/parser.y"
                                                                      {
			char const *p = strrstr((yyvsp[-3].string), (yyvsp[-1].string));

			rpn_Number(&(yyval.expr), p ? p - (yyvsp[-3].string) + 1 : 0);
		}
#line 5038 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 292: /* relocexpr_no_str: "STRLEN" "(" string ")"  */
#line 1643 "asm/parser.y"
                                                       {
			rpn_Number(&(yyval.expr), strlenUTF8((yyvsp[-1].string)));
		}
#line 5046 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 293: /* relocexpr_no_str: "CHARLEN" "(" string ")"  */
#line 1646 "asm/parser.y"
                                                        {
			rpn_Number(&(yyval.expr), charlenUTF8((yyvsp[-1].string)));
		}
#line 5054 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 294: /* relocexpr_no_str: "INCHARMAP" "(" string ")"  */
#line 1649 "asm/parser.y"
                                                          {
			rpn_Number(&(yyval.expr), charmap_HasChar((yyvsp[-1].string)));
		}
#line 5062 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 295: /* relocexpr_no_str: "(" relocexpr ")"  */
#line 1652 "asm/parser.y"
                                              { (yyval.expr) = (yyvsp[-1].expr); }
#line 5068 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 296: /* uconst: const  */
#line 1655 "asm/parser.y"
                        {
			(yyval.constValue) = (yyvsp[0].constValue);
			if ((yyval.constValue) < 0)
				fatalerror("Constant must not be negative: %d\n", (yyvsp[0].constValue));
		}
#line 5078 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 297: /* const: relocexpr  */
#line 1662 "asm/parser.y"
                            { (yyval.constValue) = rpn_GetConstVal(&(yyvsp[0].expr)); }
#line 5084 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 298: /* const_no_str: relocexpr_no_str  */
#line 1665 "asm/parser.y"
                                   { (yyval.constValue) = rpn_GetConstVal(&(yyvsp[0].expr)); }
#line 5090 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 299: /* const_8bit: reloc_8bit  */
#line 1668 "asm/parser.y"
                             { (yyval.constValue) = rpn_GetConstVal(&(yyvsp[0].expr)); }
#line 5096 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 300: /* opt_q_arg: %empty  */
#line 1671 "asm/parser.y"
                         { (yyval.constValue) = fix_Precision(); }
#line 5102 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 301: /* opt_q_arg: "," const  */
#line 1672 "asm/parser.y"
                                {
			if ((yyvsp[0].constValue) >= 1 && (yyvsp[0].constValue) <= 31) {
				(yyval.constValue) = (yyvsp[0].constValue);
			} else {
				error("Fixed-point precision must be between 1 and 31\n");
				(yyval.constValue) = fix_Precision();
			}
		}
#line 5115 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 303: /* string: "STRSUB" "(" string "," const "," uconst ")"  */
#line 1683 "asm/parser.y"
                                                                                    {
			size_t len = strlenUTF8((yyvsp[-5].string));
			uint32_t pos = adjustNegativePos((yyvsp[-3].constValue), len, "STRSUB");

			strsubUTF8((yyval.string), sizeof((yyval.string)), (yyvsp[-5].string), pos, (yyvsp[-1].constValue));
		}
#line 5126 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 304: /* string: "STRSUB" "(" string "," const ")"  */
#line 1689 "asm/parser.y"
                                                                     {
			size_t len = strlenUTF8((yyvsp[-3].string));
			uint32_t pos = adjustNegativePos((yyvsp[-1].constValue), len, "STRSUB");

			strsubUTF8((yyval.string), sizeof((yyval.string)), (yyvsp[-3].string), pos, pos > len ? 0 : len + 1 - pos);
		}
#line 5137 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 305: /* string: "CHARSUB" "(" string "," const ")"  */
#line 1695 "asm/parser.y"
                                                                      {
			size_t len = charlenUTF8((yyvsp[-3].string));
			uint32_t pos = adjustNegativePos((yyvsp[-1].constValue), len, "CHARSUB");

			charsubUTF8((yyval.string), (yyvsp[-3].string), pos);
		}
#line 5148 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 306: /* string: "STRCAT" "(" ")"  */
#line 1701 "asm/parser.y"
                                                {
			(yyval.string)[0] = '\0';
		}
#line 5156 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 307: /* string: "STRCAT" "(" strcat_args ")"  */
#line 1704 "asm/parser.y"
                                                            {
			strcpy((yyval.string), (yyvsp[-1].string));
		}
#line 5164 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 308: /* string: "STRUPR" "(" string ")"  */
#line 1707 "asm/parser.y"
                                                       {
			upperstring((yyval.string), (yyvsp[-1].string));
		}
#line 5172 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 309: /* string: "STRLWR" "(" string ")"  */
#line 1710 "asm/parser.y"
                                                       {
			lowerstring((yyval.string), (yyvsp[-1].string));
		}
#line 5180 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 310: /* string: "STRRPL" "(" string "," string "," string ")"  */
#line 1713 "asm/parser.y"
                                                                                     {
			strrpl((yyval.string), sizeof((yyval.string)), (yyvsp[-5].string), (yyvsp[-3].string), (yyvsp[-1].string));
		}
#line 5188 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 311: /* string: "STRFMT" "(" strfmt_args ")"  */
#line 1716 "asm/parser.y"
                                                            {
			strfmt((yyval.string), sizeof((yyval.string)), (yyvsp[-1].strfmtArgs).format, (yyvsp[-1].strfmtArgs).nbArgs, (yyvsp[-1].strfmtArgs).args);
			freeStrFmtArgList(&(yyvsp[-1].strfmtArgs));
		}
#line 5197 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 312: /* string: "SECTION" "(" scoped_anon_id ")"  */
#line 1720 "asm/parser.y"
                                                                 {
			struct Symbol *sym = sym_FindScopedValidSymbol((yyvsp[-1].symName));

			if (!sym)
				fatalerror("Unknown symbol \"%s\"\n", (yyvsp[-1].symName));
			struct Section const *section = sym_GetSection(sym);

			if (!section)
				fatalerror("\"%s\" does not belong to any section\n", sym->name);
			// Section names are capped by rgbasm's maximum string length,
			// so this currently can't overflow.
			strcpy((yyval.string), section->name);
		}
#line 5215 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 314: /* strcat_args: strcat_args "," string  */
#line 1736 "asm/parser.y"
                                             {
			int ret = snprintf((yyval.string), sizeof((yyval.string)), "%s%s", (yyvsp[-2].string), (yyvsp[0].string));

			if (ret == -1)
				fatalerror("snprintf error in STRCAT: %s\n", strerror(errno));
			else if ((unsigned int)ret >= sizeof((yyval.string)))
				warning(WARNING_LONG_STR, "STRCAT: String too long '%s%s'\n",
					(yyvsp[-2].string), (yyvsp[0].string));
		}
#line 5229 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 315: /* strfmt_args: string strfmt_va_args  */
#line 1747 "asm/parser.y"
                                        {
			(yyval.strfmtArgs).format = strdup((yyvsp[-1].string));
			(yyval.strfmtArgs).capacity = (yyvsp[0].strfmtArgs).capacity;
			(yyval.strfmtArgs).nbArgs = (yyvsp[0].strfmtArgs).nbArgs;
			(yyval.strfmtArgs).args = (yyvsp[0].strfmtArgs).args;
		}
#line 5240 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 316: /* strfmt_va_args: %empty  */
#line 1755 "asm/parser.y"
                         {
			initStrFmtArgList(&(yyval.strfmtArgs));
		}
#line 5248 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 317: /* strfmt_va_args: strfmt_va_args "," const_no_str  */
#line 1758 "asm/parser.y"
                                                      {
			size_t i = nextStrFmtArgListIndex(&(yyvsp[-2].strfmtArgs));

			(yyvsp[-2].strfmtArgs).args[i].number = (yyvsp[0].constValue);
			(yyvsp[-2].strfmtArgs).args[i].isNumeric = true;
			(yyval.strfmtArgs) = (yyvsp[-2].strfmtArgs);
		}
#line 5260 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 318: /* strfmt_va_args: strfmt_va_args "," string  */
#line 1765 "asm/parser.y"
                                                {
			size_t i = nextStrFmtArgListIndex(&(yyvsp[-2].strfmtArgs));

			(yyvsp[-2].strfmtArgs).args[i].string = strdup((yyvsp[0].string));
			(yyvsp[-2].strfmtArgs).args[i].isNumeric = false;
			(yyval.strfmtArgs) = (yyvsp[-2].strfmtArgs);
		}
#line 5272 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 319: /* section: "SECTION" sectmod string "," sectiontype sectorg sectattrs  */
#line 1774 "asm/parser.y"
                                                                                     {
			sect_NewSection((yyvsp[-4].string), (enum SectionType)(yyvsp[-2].constValue), (yyvsp[-1].constValue), &(yyvsp[0].sectSpec), (yyvsp[-5].sectMod));
		}
#line 5280 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 320: /* sectmod: %empty  */
#line 1779 "asm/parser.y"
                         { (yyval.sectMod) = SECTION_NORMAL; }
#line 5286 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 321: /* sectmod: "UNION"  */
#line 1780 "asm/parser.y"
                              { (yyval.sectMod) = SECTION_UNION; }
#line 5292 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 322: /* sectmod: "FRAGMENT"  */
#line 1781 "asm/parser.y"
                                 { (yyval.sectMod) = SECTION_FRAGMENT; }
#line 5298 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 323: /* sectiontype: "WRAM0"  */
#line 1784 "asm/parser.y"
                               { (yyval.constValue) = SECTTYPE_WRAM0; }
#line 5304 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 324: /* sectiontype: "VRAM"  */
#line 1785 "asm/parser.y"
                              { (yyval.constValue) = SECTTYPE_VRAM; }
#line 5310 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 325: /* sectiontype: "ROMX"  */
#line 1786 "asm/parser.y"
                              { (yyval.constValue) = SECTTYPE_ROMX; }
#line 5316 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 326: /* sectiontype: "ROM0"  */
#line 1787 "asm/parser.y"
                              { (yyval.constValue) = SECTTYPE_ROM0; }
#line 5322 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 327: /* sectiontype: "HRAM"  */
#line 1788 "asm/parser.y"
                              { (yyval.constValue) = SECTTYPE_HRAM; }
#line 5328 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 328: /* sectiontype: "WRAMX"  */
#line 1789 "asm/parser.y"
                               { (yyval.constValue) = SECTTYPE_WRAMX; }
#line 5334 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 329: /* sectiontype: "SRAM"  */
#line 1790 "asm/parser.y"
                              { (yyval.constValue) = SECTTYPE_SRAM; }
#line 5340 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 330: /* sectiontype: "OAM"  */
#line 1791 "asm/parser.y"
                             { (yyval.constValue) = SECTTYPE_OAM; }
#line 5346 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 331: /* sectorg: %empty  */
#line 1794 "asm/parser.y"
                         { (yyval.constValue) = -1; }
#line 5352 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 332: /* sectorg: "[" uconst "]"  */
#line 1795 "asm/parser.y"
                                           {
			if ((yyvsp[-1].constValue) < 0 || (yyvsp[-1].constValue) >= 0x10000) {
				error("Address $%x is not 16-bit\n", (yyvsp[-1].constValue));
				(yyval.constValue) = -1;
			} else {
				(yyval.constValue) = (yyvsp[-1].constValue);
			}
		}
#line 5365 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 333: /* sectattrs: %empty  */
#line 1805 "asm/parser.y"
                         {
			(yyval.sectSpec).alignment = 0;
			(yyval.sectSpec).alignOfs = 0;
			(yyval.sectSpec).bank = -1;
		}
#line 5375 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 334: /* sectattrs: sectattrs "," "ALIGN" "[" uconst "]"  */
#line 1810 "asm/parser.y"
                                                                        {
			(yyval.sectSpec).alignment = (yyvsp[-1].constValue);
		}
#line 5383 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 335: /* sectattrs: sectattrs "," "ALIGN" "[" uconst "," uconst "]"  */
#line 1813 "asm/parser.y"
                                                                                       {
			(yyval.sectSpec).alignment = (yyvsp[-3].constValue);
			(yyval.sectSpec).alignOfs = (yyvsp[-1].constValue);
		}
#line 5392 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 336: /* sectattrs: sectattrs "," "BANK" "[" uconst "]"  */
#line 1817 "asm/parser.y"
                                                                       {
			// We cannot check the validity of this now
			(yyval.sectSpec).bank = (yyvsp[-1].constValue);
		}
#line 5401 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 385: /* z80_adc: "adc" op_a_n  */
#line 1875 "asm/parser.y"
                                   {
			sect_AbsByte(0xCE);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5410 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 386: /* z80_adc: "adc" op_a_r  */
#line 1879 "asm/parser.y"
                                   { sect_AbsByte(0x88 | (yyvsp[0].constValue)); }
#line 5416 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 387: /* z80_add: "add" op_a_n  */
#line 1882 "asm/parser.y"
                                   {
			sect_AbsByte(0xC6);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5425 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 388: /* z80_add: "add" op_a_r  */
#line 1886 "asm/parser.y"
                                   { sect_AbsByte(0x80 | (yyvsp[0].constValue)); }
#line 5431 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 389: /* z80_add: "add" "hl" "," reg_ss  */
#line 1887 "asm/parser.y"
                                                     { sect_AbsByte(0x09 | ((yyvsp[0].constValue) << 4)); }
#line 5437 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 390: /* z80_add: "add" "sp" "," reloc_8bit  */
#line 1888 "asm/parser.y"
                                                         {
			sect_AbsByte(0xE8);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5446 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 391: /* z80_and: "and" op_a_n  */
#line 1895 "asm/parser.y"
                                   {
			sect_AbsByte(0xE6);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5455 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 392: /* z80_and: "and" op_a_r  */
#line 1899 "asm/parser.y"
                                   { sect_AbsByte(0xA0 | (yyvsp[0].constValue)); }
#line 5461 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 393: /* z80_bit: "bit" const_3bit "," reg_r  */
#line 1902 "asm/parser.y"
                                                     {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x40 | ((yyvsp[-2].constValue) << 3) | (yyvsp[0].constValue));
		}
#line 5470 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 394: /* z80_call: "call" reloc_16bit  */
#line 1908 "asm/parser.y"
                                         {
			sect_AbsByte(0xCD);
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5479 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 395: /* z80_call: "call" ccode_expr "," reloc_16bit  */
#line 1912 "asm/parser.y"
                                                            {
			sect_AbsByte(0xC4 | ((yyvsp[-2].constValue) << 3));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5488 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 396: /* z80_ccf: "ccf"  */
#line 1918 "asm/parser.y"
                            { sect_AbsByte(0x3F); }
#line 5494 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 397: /* z80_cp: "cp" op_a_n  */
#line 1921 "asm/parser.y"
                                  {
			sect_AbsByte(0xFE);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5503 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 398: /* z80_cp: "cp" op_a_r  */
#line 1925 "asm/parser.y"
                                  { sect_AbsByte(0xB8 | (yyvsp[0].constValue)); }
#line 5509 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 399: /* z80_cpl: "cpl"  */
#line 1928 "asm/parser.y"
                            { sect_AbsByte(0x2F); }
#line 5515 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 400: /* z80_daa: "daa"  */
#line 1931 "asm/parser.y"
                            { sect_AbsByte(0x27); }
#line 5521 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 401: /* z80_dec: "dec" reg_r  */
#line 1934 "asm/parser.y"
                                  { sect_AbsByte(0x05 | ((yyvsp[0].constValue) << 3)); }
#line 5527 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 402: /* z80_dec: "dec" reg_ss  */
#line 1935 "asm/parser.y"
                                   { sect_AbsByte(0x0B | ((yyvsp[0].constValue) << 4)); }
#line 5533 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 403: /* z80_di: "di"  */
#line 1938 "asm/parser.y"
                           { sect_AbsByte(0xF3); }
#line 5539 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 404: /* z80_ei: "ei"  */
#line 1941 "asm/parser.y"
                           { sect_AbsByte(0xFB); }
#line 5545 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 405: /* z80_halt: "halt"  */
#line 1944 "asm/parser.y"
                             {
			sect_AbsByte(0x76);
			if (haltNop) {
				if (warnOnHaltNop) {
					warnOnHaltNop = false;
					warning(WARNING_OBSOLETE,
						"Automatic `nop` after `halt` is deprecated\n");
				}
				sect_AbsByte(0x00);
			}
		}
#line 5561 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 406: /* z80_inc: "inc" reg_r  */
#line 1957 "asm/parser.y"
                                  { sect_AbsByte(0x04 | ((yyvsp[0].constValue) << 3)); }
#line 5567 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 407: /* z80_inc: "inc" reg_ss  */
#line 1958 "asm/parser.y"
                                   { sect_AbsByte(0x03 | ((yyvsp[0].constValue) << 4)); }
#line 5573 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 408: /* z80_jp: "jp" reloc_16bit  */
#line 1961 "asm/parser.y"
                                       {
			sect_AbsByte(0xC3);
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5582 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 409: /* z80_jp: "jp" ccode_expr "," reloc_16bit  */
#line 1965 "asm/parser.y"
                                                          {
			sect_AbsByte(0xC2 | ((yyvsp[-2].constValue) << 3));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5591 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 410: /* z80_jp: "jp" "hl"  */
#line 1969 "asm/parser.y"
                                     {
			sect_AbsByte(0xE9);
		}
#line 5599 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 411: /* z80_jr: "jr" reloc_16bit  */
#line 1974 "asm/parser.y"
                                       {
			sect_AbsByte(0x18);
			sect_PCRelByte(&(yyvsp[0].expr), 1);
		}
#line 5608 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 412: /* z80_jr: "jr" ccode_expr "," reloc_16bit  */
#line 1978 "asm/parser.y"
                                                          {
			sect_AbsByte(0x20 | ((yyvsp[-2].constValue) << 3));
			sect_PCRelByte(&(yyvsp[0].expr), 1);
		}
#line 5617 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 413: /* z80_ldi: "ldi" "[" "hl" "]" "," T_MODE_A  */
#line 1984 "asm/parser.y"
                                                                         {
			sect_AbsByte(0x02 | (2 << 4));
		}
#line 5625 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 414: /* z80_ldi: "ldi" T_MODE_A "," "[" "hl" "]"  */
#line 1987 "asm/parser.y"
                                                                         {
			sect_AbsByte(0x0A | (2 << 4));
		}
#line 5633 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 415: /* z80_ldd: "ldd" "[" "hl" "]" "," T_MODE_A  */
#line 1992 "asm/parser.y"
                                                                         {
			sect_AbsByte(0x02 | (3 << 4));
		}
#line 5641 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 416: /* z80_ldd: "ldd" T_MODE_A "," "[" "hl" "]"  */
#line 1995 "asm/parser.y"
                                                                         {
			sect_AbsByte(0x0A | (3 << 4));
		}
#line 5649 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 417: /* z80_ldio: "ldh" T_MODE_A "," op_mem_ind  */
#line 2000 "asm/parser.y"
                                                        {
			rpn_CheckHRAM(&(yyvsp[0].expr), &(yyvsp[0].expr));

			sect_AbsByte(0xF0);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5660 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 418: /* z80_ldio: "ldh" op_mem_ind "," T_MODE_A  */
#line 2006 "asm/parser.y"
                                                        {
			rpn_CheckHRAM(&(yyvsp[-2].expr), &(yyvsp[-2].expr));

			sect_AbsByte(0xE0);
			sect_RelByte(&(yyvsp[-2].expr), 1);
		}
#line 5671 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 419: /* z80_ldio: "ldh" T_MODE_A "," c_ind  */
#line 2012 "asm/parser.y"
                                                   {
			sect_AbsByte(0xF2);
		}
#line 5679 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 420: /* z80_ldio: "ldh" c_ind "," T_MODE_A  */
#line 2015 "asm/parser.y"
                                                   {
			sect_AbsByte(0xE2);
		}
#line 5687 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 422: /* c_ind: "[" relocexpr "+" T_MODE_C "]"  */
#line 2021 "asm/parser.y"
                                                                {
			if (!rpn_isKnown(&(yyvsp[-3].expr)) || (yyvsp[-3].expr).val != 0xFF00)
				error("Expected constant expression equal to $FF00 for \"$ff00+c\"\n");
		}
#line 5696 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 431: /* z80_ld_hl: "ld" "hl" "," "sp" reloc_8bit_offset  */
#line 2037 "asm/parser.y"
                                                                         {
			sect_AbsByte(0xF8);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5705 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 432: /* z80_ld_hl: "ld" "hl" "," reloc_16bit  */
#line 2041 "asm/parser.y"
                                                         {
			sect_AbsByte(0x01 | (REG_HL << 4));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5714 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 433: /* z80_ld_sp: "ld" "sp" "," "hl"  */
#line 2047 "asm/parser.y"
                                                       { sect_AbsByte(0xF9); }
#line 5720 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 434: /* z80_ld_sp: "ld" "sp" "," reloc_16bit  */
#line 2048 "asm/parser.y"
                                                         {
			sect_AbsByte(0x01 | (REG_SP << 4));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5729 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 435: /* z80_ld_mem: "ld" op_mem_ind "," "sp"  */
#line 2054 "asm/parser.y"
                                                        {
			sect_AbsByte(0x08);
			sect_RelWord(&(yyvsp[-2].expr), 1);
		}
#line 5738 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 436: /* z80_ld_mem: "ld" op_mem_ind "," T_MODE_A  */
#line 2058 "asm/parser.y"
                                                       {
			if (optimizeLoads && rpn_isKnown(&(yyvsp[-2].expr))
			 && (yyvsp[-2].expr).val >= 0xFF00) {
				if (warnOnLdOpt) {
					warnOnLdOpt = false;
					warning(WARNING_OBSOLETE,
						"Automatic `ld` to `ldh` optimization is deprecated\n");
				}
				sect_AbsByte(0xE0);
				sect_AbsByte((yyvsp[-2].expr).val & 0xFF);
				rpn_Free(&(yyvsp[-2].expr));
			} else {
				sect_AbsByte(0xEA);
				sect_RelWord(&(yyvsp[-2].expr), 1);
			}
		}
#line 5759 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 437: /* z80_ld_cind: "ld" c_ind "," T_MODE_A  */
#line 2076 "asm/parser.y"
                                                  {
			sect_AbsByte(0xE2);
		}
#line 5767 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 438: /* z80_ld_rr: "ld" reg_rr "," T_MODE_A  */
#line 2081 "asm/parser.y"
                                                   {
			sect_AbsByte(0x02 | ((yyvsp[-2].constValue) << 4));
		}
#line 5775 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 439: /* z80_ld_r: "ld" reg_r "," reloc_8bit  */
#line 2086 "asm/parser.y"
                                                    {
			sect_AbsByte(0x06 | ((yyvsp[-2].constValue) << 3));
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5784 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 440: /* z80_ld_r: "ld" reg_r "," reg_r  */
#line 2090 "asm/parser.y"
                                               {
			if (((yyvsp[-2].constValue) == REG_HL_IND) && ((yyvsp[0].constValue) == REG_HL_IND))
				error("LD [HL],[HL] not a valid instruction\n");
			else
				sect_AbsByte(0x40 | ((yyvsp[-2].constValue) << 3) | (yyvsp[0].constValue));
		}
#line 5795 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 441: /* z80_ld_a: "ld" reg_r "," c_ind  */
#line 2098 "asm/parser.y"
                                               {
			if ((yyvsp[-2].constValue) == REG_A)
				sect_AbsByte(0xF2);
			else
				error("Destination operand must be A\n");
		}
#line 5806 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 442: /* z80_ld_a: "ld" reg_r "," reg_rr  */
#line 2104 "asm/parser.y"
                                                {
			if ((yyvsp[-2].constValue) == REG_A)
				sect_AbsByte(0x0A | ((yyvsp[0].constValue) << 4));
			else
				error("Destination operand must be A\n");
		}
#line 5817 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 443: /* z80_ld_a: "ld" reg_r "," op_mem_ind  */
#line 2110 "asm/parser.y"
                                                    {
			if ((yyvsp[-2].constValue) == REG_A) {
				if (optimizeLoads && rpn_isKnown(&(yyvsp[0].expr))
				 && (yyvsp[0].expr).val >= 0xFF00) {
					if (warnOnLdOpt) {
						warnOnLdOpt = false;
						warning(WARNING_OBSOLETE,
							"Automatic `ld` to `ldh` optimization is deprecated\n");
					}
					sect_AbsByte(0xF0);
					sect_AbsByte((yyvsp[0].expr).val & 0xFF);
					rpn_Free(&(yyvsp[0].expr));
				} else {
					sect_AbsByte(0xFA);
					sect_RelWord(&(yyvsp[0].expr), 1);
				}
			} else {
				error("Destination operand must be A\n");
				rpn_Free(&(yyvsp[0].expr));
			}
		}
#line 5843 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 444: /* z80_ld_ss: "ld" "bc" "," reloc_16bit  */
#line 2133 "asm/parser.y"
                                                         {
			sect_AbsByte(0x01 | (REG_BC << 4));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5852 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 445: /* z80_ld_ss: "ld" "de" "," reloc_16bit  */
#line 2137 "asm/parser.y"
                                                         {
			sect_AbsByte(0x01 | (REG_DE << 4));
			sect_RelWord(&(yyvsp[0].expr), 1);
		}
#line 5861 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 446: /* z80_nop: "nop"  */
#line 2145 "asm/parser.y"
                            { sect_AbsByte(0x00); }
#line 5867 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 447: /* z80_or: "or" op_a_n  */
#line 2148 "asm/parser.y"
                                  {
			sect_AbsByte(0xF6);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 5876 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 448: /* z80_or: "or" op_a_r  */
#line 2152 "asm/parser.y"
                                  { sect_AbsByte(0xB0 | (yyvsp[0].constValue)); }
#line 5882 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 449: /* z80_pop: "pop" reg_tt  */
#line 2155 "asm/parser.y"
                                   { sect_AbsByte(0xC1 | ((yyvsp[0].constValue) << 4)); }
#line 5888 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 450: /* z80_push: "push" reg_tt  */
#line 2158 "asm/parser.y"
                                    { sect_AbsByte(0xC5 | ((yyvsp[0].constValue) << 4)); }
#line 5894 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 451: /* z80_res: "res" const_3bit "," reg_r  */
#line 2161 "asm/parser.y"
                                                     {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x80 | ((yyvsp[-2].constValue) << 3) | (yyvsp[0].constValue));
		}
#line 5903 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 452: /* z80_ret: "ret"  */
#line 2167 "asm/parser.y"
                            { sect_AbsByte(0xC9); }
#line 5909 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 453: /* z80_ret: "ret" ccode_expr  */
#line 2168 "asm/parser.y"
                                       { sect_AbsByte(0xC0 | ((yyvsp[0].constValue) << 3)); }
#line 5915 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 454: /* z80_reti: "reti"  */
#line 2171 "asm/parser.y"
                             { sect_AbsByte(0xD9); }
#line 5921 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 455: /* z80_rl: "rl" reg_r  */
#line 2174 "asm/parser.y"
                                 {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x10 | (yyvsp[0].constValue));
		}
#line 5930 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 456: /* z80_rla: "rla"  */
#line 2180 "asm/parser.y"
                            { sect_AbsByte(0x17); }
#line 5936 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 457: /* z80_rlc: "rlc" reg_r  */
#line 2183 "asm/parser.y"
                                  {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x00 | (yyvsp[0].constValue));
		}
#line 5945 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 458: /* z80_rlca: "rlca"  */
#line 2189 "asm/parser.y"
                             { sect_AbsByte(0x07); }
#line 5951 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 459: /* z80_rr: "rr" reg_r  */
#line 2192 "asm/parser.y"
                                 {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x18 | (yyvsp[0].constValue));
		}
#line 5960 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 460: /* z80_rra: "rra"  */
#line 2198 "asm/parser.y"
                            { sect_AbsByte(0x1F); }
#line 5966 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 461: /* z80_rrc: "rrc" reg_r  */
#line 2201 "asm/parser.y"
                                  {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x08 | (yyvsp[0].constValue));
		}
#line 5975 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 462: /* z80_rrca: "rrca"  */
#line 2207 "asm/parser.y"
                             { sect_AbsByte(0x0F); }
#line 5981 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 463: /* z80_rst: "rst" reloc_8bit  */
#line 2210 "asm/parser.y"
                                       {
			rpn_CheckRST(&(yyvsp[0].expr), &(yyvsp[0].expr));
			if (!rpn_isKnown(&(yyvsp[0].expr)))
				sect_RelByte(&(yyvsp[0].expr), 0);
			else
				sect_AbsByte(0xC7 | (yyvsp[0].expr).val);
			rpn_Free(&(yyvsp[0].expr));
		}
#line 5994 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 464: /* z80_sbc: "sbc" op_a_n  */
#line 2220 "asm/parser.y"
                                   {
			sect_AbsByte(0xDE);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 6003 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 465: /* z80_sbc: "sbc" op_a_r  */
#line 2224 "asm/parser.y"
                                   { sect_AbsByte(0x98 | (yyvsp[0].constValue)); }
#line 6009 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 466: /* z80_scf: "scf"  */
#line 2227 "asm/parser.y"
                            { sect_AbsByte(0x37); }
#line 6015 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 467: /* z80_set: "set" const_3bit "," reg_r  */
#line 2230 "asm/parser.y"
                                                     {
			sect_AbsByte(0xCB);
			sect_AbsByte(0xC0 | ((yyvsp[-2].constValue) << 3) | (yyvsp[0].constValue));
		}
#line 6024 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 468: /* z80_sla: "sla" reg_r  */
#line 2236 "asm/parser.y"
                                  {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x20 | (yyvsp[0].constValue));
		}
#line 6033 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 469: /* z80_sra: "sra" reg_r  */
#line 2242 "asm/parser.y"
                                  {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x28 | (yyvsp[0].constValue));
		}
#line 6042 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 470: /* z80_srl: "srl" reg_r  */
#line 2248 "asm/parser.y"
                                  {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x38 | (yyvsp[0].constValue));
		}
#line 6051 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 471: /* z80_stop: "stop"  */
#line 2254 "asm/parser.y"
                             {
			sect_AbsByte(0x10);
			sect_AbsByte(0x00);
		}
#line 6060 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 472: /* z80_stop: "stop" reloc_8bit  */
#line 2258 "asm/parser.y"
                                        {
			sect_AbsByte(0x10);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 6069 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 473: /* z80_sub: "sub" op_a_n  */
#line 2264 "asm/parser.y"
                                   {
			sect_AbsByte(0xD6);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 6078 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 474: /* z80_sub: "sub" op_a_r  */
#line 2268 "asm/parser.y"
                                   { sect_AbsByte(0x90 | (yyvsp[0].constValue)); }
#line 6084 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 475: /* z80_swap: "swap" reg_r  */
#line 2271 "asm/parser.y"
                                   {
			sect_AbsByte(0xCB);
			sect_AbsByte(0x30 | (yyvsp[0].constValue));
		}
#line 6093 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 476: /* z80_xor: "xor" op_a_n  */
#line 2277 "asm/parser.y"
                                   {
			sect_AbsByte(0xEE);
			sect_RelByte(&(yyvsp[0].expr), 1);
		}
#line 6102 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 477: /* z80_xor: "xor" op_a_r  */
#line 2281 "asm/parser.y"
                                   { sect_AbsByte(0xA8 | (yyvsp[0].constValue)); }
#line 6108 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 478: /* op_mem_ind: "[" reloc_16bit "]"  */
#line 2284 "asm/parser.y"
                                                { (yyval.expr) = (yyvsp[-1].expr); }
#line 6114 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 480: /* op_a_r: T_MODE_A "," reg_r  */
#line 2288 "asm/parser.y"
                                         { (yyval.constValue) = (yyvsp[0].constValue); }
#line 6120 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 482: /* op_a_n: T_MODE_A "," reloc_8bit  */
#line 2292 "asm/parser.y"
                                              { (yyval.expr) = (yyvsp[0].expr); }
#line 6126 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 498: /* ccode_expr: "!" ccode_expr  */
#line 2324 "asm/parser.y"
                                           {
			(yyval.constValue) = (yyvsp[0].constValue) ^ 1;
		}
#line 6134 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 499: /* ccode: "nz"  */
#line 2329 "asm/parser.y"
                          { (yyval.constValue) = CC_NZ; }
#line 6140 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 500: /* ccode: "z"  */
#line 2330 "asm/parser.y"
                         { (yyval.constValue) = CC_Z; }
#line 6146 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 501: /* ccode: "nc"  */
#line 2331 "asm/parser.y"
                          { (yyval.constValue) = CC_NC; }
#line 6152 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 502: /* ccode: "c"  */
#line 2332 "asm/parser.y"
                            { (yyval.constValue) = CC_C; }
#line 6158 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 503: /* reg_r: T_MODE_B  */
#line 2335 "asm/parser.y"
                           { (yyval.constValue) = REG_B; }
#line 6164 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 504: /* reg_r: T_MODE_C  */
#line 2336 "asm/parser.y"
                           { (yyval.constValue) = REG_C; }
#line 6170 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 505: /* reg_r: T_MODE_D  */
#line 2337 "asm/parser.y"
                           { (yyval.constValue) = REG_D; }
#line 6176 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 506: /* reg_r: T_MODE_E  */
#line 2338 "asm/parser.y"
                           { (yyval.constValue) = REG_E; }
#line 6182 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 507: /* reg_r: T_MODE_H  */
#line 2339 "asm/parser.y"
                           { (yyval.constValue) = REG_H; }
#line 6188 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 508: /* reg_r: T_MODE_L  */
#line 2340 "asm/parser.y"
                           { (yyval.constValue) = REG_L; }
#line 6194 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 509: /* reg_r: "[" "hl" "]"  */
#line 2341 "asm/parser.y"
                                              { (yyval.constValue) = REG_HL_IND; }
#line 6200 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 510: /* reg_r: T_MODE_A  */
#line 2342 "asm/parser.y"
                           { (yyval.constValue) = REG_A; }
#line 6206 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 511: /* reg_tt: "bc"  */
#line 2345 "asm/parser.y"
                            { (yyval.constValue) = REG_BC; }
#line 6212 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 512: /* reg_tt: "de"  */
#line 2346 "asm/parser.y"
                            { (yyval.constValue) = REG_DE; }
#line 6218 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 513: /* reg_tt: "hl"  */
#line 2347 "asm/parser.y"
                            { (yyval.constValue) = REG_HL; }
#line 6224 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 514: /* reg_tt: "af"  */
#line 2348 "asm/parser.y"
                            { (yyval.constValue) = REG_AF; }
#line 6230 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 515: /* reg_ss: "bc"  */
#line 2351 "asm/parser.y"
                            { (yyval.constValue) = REG_BC; }
#line 6236 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 516: /* reg_ss: "de"  */
#line 2352 "asm/parser.y"
                            { (yyval.constValue) = REG_DE; }
#line 6242 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 517: /* reg_ss: "hl"  */
#line 2353 "asm/parser.y"
                            { (yyval.constValue) = REG_HL; }
#line 6248 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 518: /* reg_ss: "sp"  */
#line 2354 "asm/parser.y"
                            { (yyval.constValue) = REG_SP; }
#line 6254 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 519: /* reg_rr: "[" "bc" "]"  */
#line 2357 "asm/parser.y"
                                              { (yyval.constValue) = REG_BC_IND; }
#line 6260 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 520: /* reg_rr: "[" "de" "]"  */
#line 2358 "asm/parser.y"
                                              { (yyval.constValue) = REG_DE_IND; }
#line 6266 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 521: /* reg_rr: hl_ind_inc  */
#line 2359 "asm/parser.y"
                             { (yyval.constValue) = REG_HL_INDINC; }
#line 6272 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;

  case 522: /* reg_rr: hl_ind_dec  */
#line 2360 "asm/parser.y"
                             { (yyval.constValue) = REG_HL_INDDEC; }
#line 6278 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"
    break;


#line 6282 "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/parser.cpp"

        default: break;
      }
    if (yychar_backup != yychar)
      YY_LAC_DISCARD ("yychar change");
  }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yyesa, &yyes, &yyes_capacity, yytoken};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        if (yychar != YYEMPTY)
          YY_LAC_ESTABLISH;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= T_EOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == T_EOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  /* If the stack popping above didn't lose the initial context for the
     current lookahead token, the shift below will for sure.  */
  YY_LAC_DISCARD ("error recovery");

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yyes != yyesa)
    YYSTACK_FREE (yyes);
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}

#line 2371 "asm/parser.y"
